

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void log_info(char *message,...)

{
  FILE *file;
  char in_AL;
  CharBuff *buff;
  char *message_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list list;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  list[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  list[0].overflow_arg_area = &stack0x00000008;
  list[0].gp_offset = 8;
  list[0].fp_offset = 0x30;
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  buff = new_buff(0x400);
  append_str(buff,"\x1b[32mINFO\x1b[0m: ");
  append_str(buff,message);
  file = _stdout;
  message_00 = to_string(buff);
  log_log(1,file,message_00,list);
  recycle_buff(buff);
  return;
}

Assistant:

void log_info(const char* message, ...){
    va_list list;
    va_start(list,message);
    CharBuff* buff = new_buff(1024);
    append_str(buff, TAG_INFO);
    append_str(buff, message);
    log_log(LOG_LEVEL_INFO, stdout, to_string(buff), list);
    va_end(list);
    recycle_buff(buff);
}